

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  ulong uVar39;
  ulong uVar40;
  Mat *m;
  Mat *pMVar41;
  uint uVar42;
  uint uVar43;
  undefined1 (*pauVar44) [64];
  int iVar45;
  uint uVar46;
  Option *opt_00;
  undefined1 (*pauVar47) [64];
  long lVar48;
  long lVar49;
  int iVar50;
  float *pfVar51;
  float *pfVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  float fVar78;
  undefined1 auVar79 [16];
  undefined8 uVar82;
  undefined8 uVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined1 auVar92 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [56];
  undefined1 auVar95 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  __m128 afVar100;
  binary_op_rpow op_1;
  binary_op_ratan2 op;
  __m128 _b_1;
  __m128 _b;
  __m256 _b_avx;
  binary_op_rpow local_27b;
  ushort local_27a;
  long local_278;
  long local_270;
  uint local_264;
  binary_op_ratan2 local_260 [8];
  float afStack_258 [2];
  Mat *local_250;
  Mat *local_248;
  float local_240 [2];
  float afStack_238 [2];
  float afStack_230 [2];
  float afStack_228 [9];
  uint local_204;
  __m128 local_200;
  float afStack_1f0 [2];
  float afStack_1e8 [2];
  float afStack_1e0 [2];
  float afStack_1d8 [2];
  float afStack_1d0 [2];
  float afStack_1c8 [14];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  float afStack_170 [2];
  float afStack_168 [2];
  float afStack_160 [2];
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  __m256 local_140;
  float afStack_120 [2];
  float afStack_118 [2];
  float afStack_110 [2];
  float afStack_108 [2];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar83._0_4_ = pMVar4[1].d;
  uVar83._4_4_ = pMVar4[1].c;
  auVar79._8_8_ = uVar83;
  auVar79._0_8_ = uVar83;
  auVar98._0_4_ = pMVar4[1].w;
  auVar98._4_4_ = pMVar4[1].h;
  auVar98._8_4_ = pMVar4[1].d;
  auVar98._12_4_ = pMVar4[1].c;
  auVar98 = vpmulld_avx(auVar79,auVar98);
  auVar79 = vpshufd_avx(auVar98,0x55);
  auVar93 = ZEXT1664(auVar79);
  auVar98 = vpmulld_avx(auVar98,auVar79);
  iVar45 = auVar98._0_4_ * pMVar4[1].elempack;
  pMVar41 = pMVar4 + 1;
  if ((pMVar4[1].dims <= pMVar4->dims) || (bVar5 = true, iVar45 == 1)) {
    bVar5 = pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar45;
  }
  uVar46 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3]);
  m = pMVar4;
  if (((bVar5) && (uVar42 = uVar46 - 1, m = pMVar41, pMVar41 = pMVar4, uVar42 < 0xb)) &&
     ((0x7e5U >> (uVar42 & 0x1f) & 1) != 0)) {
    uVar46 = *(uint *)(&DAT_0059d740 + (ulong)uVar42 * 4);
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar4,m,opt->blob_allocator);
  if (pMVar4->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar4->c * pMVar4->cstep == 0) {
    return -100;
  }
  iVar45 = pMVar41->elempack;
  iVar50 = pMVar41->w;
  iVar1 = pMVar41->h;
  iVar2 = pMVar41->d;
  iVar3 = pMVar41->c;
  if (iVar2 * iVar3 * iVar1 * iVar50 * iVar45 == 1) {
    if (0xb < uVar46) {
      return 0;
    }
    fVar78 = *pMVar41->data;
    local_190 = ZEXT416((uint)fVar78);
    auVar98 = ZEXT416((uint)fVar78);
    local_250 = pMVar4;
    local_248 = m;
    switch(uVar46) {
    case 0:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar93 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar55 = vaddps_avx512f(auVar93,*pauVar44);
              *pauVar47 = auVar55;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar92._0_4_ = auVar93._0_4_ + *(float *)*pauVar44;
            auVar92._4_4_ = auVar93._4_4_ + *(float *)(*pauVar44 + 4);
            auVar92._8_4_ = auVar93._8_4_ + *(float *)(*pauVar44 + 8);
            auVar92._12_4_ = auVar93._12_4_ + *(float *)(*pauVar44 + 0xc);
            auVar92._16_4_ = auVar93._16_4_ + *(float *)(*pauVar44 + 0x10);
            auVar92._20_4_ = auVar93._20_4_ + *(float *)(*pauVar44 + 0x14);
            auVar92._24_4_ = auVar93._24_4_ + *(float *)(*pauVar44 + 0x18);
            auVar92._28_4_ = auVar93._28_4_ + *(float *)(*pauVar44 + 0x1c);
            *(undefined1 (*) [32])*pauVar47 = auVar92;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar90._0_4_ = auVar93._0_4_ + *(float *)*pauVar44;
            auVar90._4_4_ = auVar93._4_4_ + *(float *)(*pauVar44 + 4);
            auVar90._8_4_ = auVar93._8_4_ + *(float *)(*pauVar44 + 8);
            auVar90._12_4_ = auVar93._12_4_ + *(float *)(*pauVar44 + 0xc);
            *(undefined1 (*) [16])*pauVar47 = auVar90;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              *(float *)((long)*pauVar47 + lVar48 * 4) = fVar78 + *(float *)(*pauVar44 + lVar48 * 4)
              ;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 1:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar93 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar55 = vsubps_avx512f(*pauVar44,auVar93);
              *pauVar47 = auVar55;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar92 = vsubps_avx(*(undefined1 (*) [32])*pauVar44,auVar93._0_32_);
            *(undefined1 (*) [32])*pauVar47 = auVar92;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar98 = vsubps_avx(*(undefined1 (*) [16])*pauVar44,auVar93._0_16_);
            *(undefined1 (*) [16])*pauVar47 = auVar98;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              *(float *)((long)*pauVar47 + lVar48 * 4) = *(float *)(*pauVar44 + lVar48 * 4) - fVar78
              ;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 2:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar55 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar93 = vmulps_avx512f(auVar55,*pauVar44);
              *pauVar47 = auVar93;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar59._0_4_ = auVar55._0_4_ * *(float *)*pauVar44;
            auVar59._4_4_ = auVar55._4_4_ * *(float *)(*pauVar44 + 4);
            auVar59._8_4_ = auVar55._8_4_ * *(float *)(*pauVar44 + 8);
            auVar59._12_4_ = auVar55._12_4_ * *(float *)(*pauVar44 + 0xc);
            auVar59._16_4_ = auVar55._16_4_ * *(float *)(*pauVar44 + 0x10);
            auVar59._20_4_ = auVar55._20_4_ * *(float *)(*pauVar44 + 0x14);
            auVar59._28_36_ = auVar93._28_36_;
            auVar59._24_4_ = auVar55._24_4_ * *(float *)(*pauVar44 + 0x18);
            auVar93 = ZEXT3264(auVar59._0_32_);
            *(undefined1 (*) [32])*pauVar47 = auVar59._0_32_;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar91._0_4_ = auVar55._0_4_ * *(float *)*pauVar44;
            auVar91._4_4_ = auVar55._4_4_ * *(float *)(*pauVar44 + 4);
            auVar91._8_4_ = auVar55._8_4_ * *(float *)(*pauVar44 + 8);
            auVar91._12_4_ = auVar55._12_4_ * *(float *)(*pauVar44 + 0xc);
            auVar93 = ZEXT1664(auVar91);
            *(undefined1 (*) [16])*pauVar47 = auVar91;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              fVar38 = fVar78 * *(float *)(*pauVar44 + lVar48 * 4);
              auVar93 = ZEXT464((uint)fVar38);
              *(float *)((long)*pauVar47 + lVar48 * 4) = fVar38;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 3:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar80._0_4_ = 1.0 / fVar78;
        auVar80._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar93 = vbroadcastss_avx512f(auVar80);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              in_ZMM2 = vmulps_avx512f(auVar93,*pauVar44);
              *pauVar47 = in_ZMM2;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar58._0_4_ = auVar93._0_4_ * *(float *)*pauVar44;
            auVar58._4_4_ = auVar93._4_4_ * *(float *)(*pauVar44 + 4);
            auVar58._8_4_ = auVar93._8_4_ * *(float *)(*pauVar44 + 8);
            auVar58._12_4_ = auVar93._12_4_ * *(float *)(*pauVar44 + 0xc);
            auVar58._16_4_ = auVar93._16_4_ * *(float *)(*pauVar44 + 0x10);
            auVar58._20_4_ = auVar93._20_4_ * *(float *)(*pauVar44 + 0x14);
            auVar58._28_36_ = in_ZMM2._28_36_;
            auVar58._24_4_ = auVar93._24_4_ * *(float *)(*pauVar44 + 0x18);
            in_ZMM2 = ZEXT3264(auVar58._0_32_);
            *(undefined1 (*) [32])*pauVar47 = auVar58._0_32_;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar95._0_4_ = auVar93._0_4_ * *(float *)*pauVar44;
            auVar95._4_4_ = auVar93._4_4_ * *(float *)(*pauVar44 + 4);
            auVar95._8_4_ = auVar93._8_4_ * *(float *)(*pauVar44 + 8);
            auVar95._12_4_ = auVar93._12_4_ * *(float *)(*pauVar44 + 0xc);
            in_ZMM2 = ZEXT1664(auVar95);
            *(undefined1 (*) [16])*pauVar47 = auVar95;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              fVar78 = auVar80._0_4_ * *(float *)(*pauVar44 + lVar48 * 4);
              in_ZMM2 = ZEXT464((uint)fVar78);
              *(float *)((long)*pauVar47 + lVar48 * 4) = fVar78;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 4:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar93 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar55 = vmaxps_avx512f(auVar93,*pauVar44);
              *pauVar47 = auVar55;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar92 = vmaxps_avx(auVar93._0_32_,*(undefined1 (*) [32])*pauVar44);
            *(undefined1 (*) [32])*pauVar47 = auVar92;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar79 = vmaxps_avx(auVar93._0_16_,*(undefined1 (*) [16])*pauVar44);
            *(undefined1 (*) [16])*pauVar47 = auVar79;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              auVar79 = vmaxss_avx(auVar98,ZEXT416(*(uint *)(*pauVar44 + lVar48 * 4)));
              *(int *)((long)*pauVar47 + lVar48 * 4) = auVar79._0_4_;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 5:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar93 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar55 = vminps_avx512f(auVar93,*pauVar44);
              *pauVar47 = auVar55;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar92 = vminps_avx(auVar93._0_32_,*(undefined1 (*) [32])*pauVar44);
            *(undefined1 (*) [32])*pauVar47 = auVar92;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar79 = vminps_avx(auVar93._0_16_,*(undefined1 (*) [16])*pauVar44);
            *(undefined1 (*) [16])*pauVar47 = auVar79;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              auVar79 = vminss_avx(auVar98,ZEXT416(*(uint *)(*pauVar44 + lVar48 * 4)));
              *(int *)((long)*pauVar47 + lVar48 * 4) = auVar79._0_4_;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 6:
      local_278 = (long)m->c;
      if (0 < local_278) {
        iVar45 = m->h * m->w * m->d * m->elempack;
        _local_180 = vbroadcastss_avx512f(auVar98);
        local_270 = 0;
        do {
          auVar93 = _local_180;
          pfVar52 = (float *)(local_248->cstep * local_270 * local_248->elemsize +
                             (long)local_248->data);
          pfVar51 = (float *)(local_250->cstep * local_270 * local_250->elemsize +
                             (long)local_250->data);
          local_140 = local_180._0_32_;
          afStack_120[0] = afStack_160[0];
          afStack_120[1] = afStack_160[1];
          afStack_118[0] = afStack_158[0];
          afStack_118[1] = afStack_158[1];
          afStack_110[0] = afStack_150[0];
          afStack_110[1] = afStack_150[1];
          afStack_108[0] = afStack_148[0];
          afStack_108[1] = afStack_148[1];
          if (iVar45 < 0x10) {
            uVar46 = 0;
            _local_180 = auVar93;
          }
          else {
            uVar42 = 0;
            _local_180 = auVar93;
            do {
              uVar83 = *(undefined8 *)pfVar52;
              uVar82 = *(undefined8 *)(pfVar52 + 2);
              uVar84 = *(undefined8 *)(pfVar52 + 4);
              uVar85 = *(undefined8 *)(pfVar52 + 6);
              uVar86 = *(undefined8 *)(pfVar52 + 8);
              uVar87 = *(undefined8 *)(pfVar52 + 10);
              uVar88 = *(undefined8 *)(pfVar52 + 0xc);
              uVar89 = *(undefined8 *)(pfVar52 + 0xe);
              afStack_1f0 = (float  [2])uVar84;
              afStack_1e8 = (float  [2])uVar85;
              afStack_1e0 = (float  [2])uVar86;
              afStack_1d8 = (float  [2])uVar87;
              afStack_1d0 = (float  [2])uVar88;
              afStack_1c8._0_8_ = uVar89;
              local_200._0_8_ = uVar83;
              local_200._8_8_ = uVar82;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        ((binary_op_pow *)&local_27b,(__m512 *)local_200,(__m512 *)local_140);
              *(undefined8 *)pfVar51 = uVar83;
              *(undefined8 *)(pfVar51 + 2) = uVar82;
              *(undefined8 *)(pfVar51 + 4) = uVar84;
              *(undefined8 *)(pfVar51 + 6) = uVar85;
              *(undefined8 *)(pfVar51 + 8) = uVar86;
              *(undefined8 *)(pfVar51 + 10) = uVar87;
              *(undefined8 *)(pfVar51 + 0xc) = uVar88;
              *(undefined8 *)(pfVar51 + 0xe) = uVar89;
              pfVar52 = pfVar52 + 0x10;
              pfVar51 = pfVar51 + 0x10;
              uVar46 = uVar42 + 0x10;
              iVar50 = uVar42 + 0x1f;
              uVar42 = uVar46;
              afStack_1e0 = (float  [2])uVar86;
              afStack_1d8 = (float  [2])uVar87;
              afStack_1d0 = (float  [2])uVar88;
              afStack_1c8._0_8_ = uVar89;
            } while (iVar50 < iVar45);
          }
          auVar93 = _local_180;
          local_200 = local_180;
          afStack_1f0[0] = afStack_170[0];
          afStack_1f0[1] = afStack_170[1];
          afStack_1e8[0] = afStack_168[0];
          afStack_1e8[1] = afStack_168[1];
          _local_180 = auVar93;
          if ((int)(uVar46 | 7) < iVar45) {
            uVar42 = uVar46;
            do {
              uVar83 = *(undefined8 *)pfVar52;
              uVar82 = *(undefined8 *)(pfVar52 + 2);
              uVar84 = *(undefined8 *)(pfVar52 + 4);
              uVar85 = *(undefined8 *)(pfVar52 + 6);
              local_240 = (float  [2])uVar83;
              afStack_238 = (float  [2])uVar82;
              afStack_230 = (float  [2])uVar84;
              afStack_228._0_8_ = uVar85;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_27b,(__m256 *)local_240,(__m256 *)local_200);
              *(undefined8 *)pfVar51 = uVar83;
              *(undefined8 *)(pfVar51 + 2) = uVar82;
              *(undefined8 *)(pfVar51 + 4) = uVar84;
              *(undefined8 *)(pfVar51 + 6) = uVar85;
              pfVar52 = pfVar52 + 8;
              pfVar51 = pfVar51 + 8;
              uVar46 = uVar42 + 8;
              iVar50 = uVar42 + 0xf;
              uVar42 = uVar46;
              afStack_230 = (float  [2])uVar84;
              afStack_228._0_8_ = uVar85;
            } while (iVar50 < iVar45);
          }
          uVar42 = uVar46 | 3;
          local_240 = (float  [2])local_180._0_8_;
          afStack_238 = (float  [2])local_180._8_8_;
          while ((int)uVar42 < iVar45) {
            local_260 = *(binary_op_ratan2 (*) [8])pfVar52;
            uVar83 = *(undefined8 *)(pfVar52 + 2);
            afStack_258 = (float  [2])uVar83;
            afVar100 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                 ((binary_op_pow *)&local_27b,(__m128 *)local_260,
                                  (__m128 *)local_240);
            local_260 = afVar100._0_8_;
            *(binary_op_ratan2 (*) [8])pfVar51 = local_260;
            *(undefined8 *)(pfVar51 + 2) = uVar83;
            pfVar52 = pfVar52 + 4;
            pfVar51 = pfVar51 + 4;
            uVar42 = uVar46 + 7;
            uVar46 = uVar46 + 4;
            afStack_258 = (float  [2])uVar83;
          }
          if ((int)uVar46 < iVar45) {
            lVar49 = 0;
            do {
              fVar78 = powf(pfVar52[lVar49],local_190._0_4_);
              pfVar51[lVar49] = fVar78;
              lVar49 = lVar49 + 1;
            } while (iVar45 - uVar46 != (int)lVar49);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_278);
      }
      break;
    case 7:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar93 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar55 = vsubps_avx512f(auVar93,*pauVar44);
              *pauVar47 = auVar55;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar92 = vsubps_avx(auVar93._0_32_,*(undefined1 (*) [32])*pauVar44);
            *(undefined1 (*) [32])*pauVar47 = auVar92;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar98 = vsubps_avx(auVar93._0_16_,*(undefined1 (*) [16])*pauVar44);
            *(undefined1 (*) [16])*pauVar47 = auVar98;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              *(float *)((long)*pauVar47 + lVar48 * 4) = fVar78 - *(float *)(*pauVar44 + lVar48 * 4)
              ;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 8:
      iVar45 = m->c;
      if (0 < (long)iVar45) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar93 = vbroadcastss_avx512f(auVar98);
        lVar49 = 0;
        do {
          pauVar44 = (undefined1 (*) [64])(m->cstep * lVar49 * m->elemsize + (long)m->data);
          pauVar47 = (undefined1 (*) [64])
                     (pMVar4->cstep * lVar49 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar50 = 0xf;
            do {
              auVar55 = vrcp14ps_avx512f(*pauVar44);
              in_ZMM3 = vmulps_avx512f(auVar93,auVar55);
              auVar56 = vfmsub213ps_avx512f(*pauVar44,in_ZMM3,auVar93);
              auVar55 = vfnmadd213ps_avx512f(auVar56,auVar55,in_ZMM3);
              *pauVar47 = auVar55;
              pauVar44 = pauVar44 + 1;
              pauVar47 = pauVar47 + 1;
              iVar50 = iVar50 + 0x10;
              uVar42 = uVar46 & 0xfffffff0;
            } while (iVar50 < (int)uVar46);
          }
          uVar43 = uVar42 | 7;
          while ((int)uVar43 < (int)uVar46) {
            auVar92 = vrcpps_avx(*(undefined1 (*) [32])*pauVar44);
            auVar57._0_4_ = auVar93._0_4_ * auVar92._0_4_;
            auVar57._4_4_ = auVar93._4_4_ * auVar92._4_4_;
            auVar57._8_4_ = auVar93._8_4_ * auVar92._8_4_;
            auVar57._12_4_ = auVar93._12_4_ * auVar92._12_4_;
            auVar57._16_4_ = auVar93._16_4_ * auVar92._16_4_;
            auVar57._20_4_ = auVar93._20_4_ * auVar92._20_4_;
            auVar57._28_36_ = in_ZMM3._28_36_;
            auVar57._24_4_ = auVar93._24_4_ * auVar92._24_4_;
            auVar97 = auVar57._0_32_;
            in_ZMM3 = ZEXT3264(auVar97);
            auVar98 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar44,auVar97,auVar93._0_32_);
            auVar98 = vfnmadd213ps_fma(ZEXT1632(auVar98),auVar92,auVar97);
            *(undefined1 (*) [32])*pauVar47 = ZEXT1632(auVar98);
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            uVar43 = uVar42 + 0xf;
            uVar42 = uVar42 + 8;
          }
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            auVar98 = vrcpps_avx(*(undefined1 (*) [16])*pauVar44);
            auVar96._0_4_ = auVar93._0_4_ * auVar98._0_4_;
            auVar96._4_4_ = auVar93._4_4_ * auVar98._4_4_;
            auVar96._8_4_ = auVar93._8_4_ * auVar98._8_4_;
            auVar96._12_4_ = auVar93._12_4_ * auVar98._12_4_;
            in_ZMM3 = ZEXT1664(auVar96);
            auVar79 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar44,auVar96,auVar93._0_16_);
            auVar98 = vfnmadd213ps_fma(auVar79,auVar98,auVar96);
            *(undefined1 (*) [16])*pauVar47 = auVar98;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
          }
          if (uVar46 - uVar42 != 0 && (int)uVar42 <= (int)uVar46) {
            lVar48 = 0;
            do {
              *(float *)((long)*pauVar47 + lVar48 * 4) = fVar78 / *(float *)(*pauVar44 + lVar48 * 4)
              ;
              lVar48 = lVar48 + 1;
            } while (uVar46 - uVar42 != (int)lVar48);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 != iVar45);
      }
      break;
    case 9:
      local_278 = (long)m->c;
      if (0 < local_278) {
        iVar45 = m->h * m->w * m->d * m->elempack;
        _local_180 = vbroadcastss_avx512f(auVar98);
        local_270 = 0;
        do {
          auVar93 = _local_180;
          pfVar52 = (float *)(local_248->cstep * local_270 * local_248->elemsize +
                             (long)local_248->data);
          pfVar51 = (float *)(local_250->cstep * local_270 * local_250->elemsize +
                             (long)local_250->data);
          local_140 = local_180._0_32_;
          afStack_120[0] = afStack_160[0];
          afStack_120[1] = afStack_160[1];
          afStack_118[0] = afStack_158[0];
          afStack_118[1] = afStack_158[1];
          afStack_110[0] = afStack_150[0];
          afStack_110[1] = afStack_150[1];
          afStack_108[0] = afStack_148[0];
          afStack_108[1] = afStack_148[1];
          if (iVar45 < 0x10) {
            uVar46 = 0;
            _local_180 = auVar93;
          }
          else {
            uVar42 = 0;
            _local_180 = auVar93;
            do {
              uVar83 = *(undefined8 *)pfVar52;
              uVar82 = *(undefined8 *)(pfVar52 + 2);
              uVar84 = *(undefined8 *)(pfVar52 + 4);
              uVar85 = *(undefined8 *)(pfVar52 + 6);
              uVar86 = *(undefined8 *)(pfVar52 + 8);
              uVar87 = *(undefined8 *)(pfVar52 + 10);
              uVar88 = *(undefined8 *)(pfVar52 + 0xc);
              uVar89 = *(undefined8 *)(pfVar52 + 0xe);
              afStack_1f0 = (float  [2])uVar84;
              afStack_1e8 = (float  [2])uVar85;
              afStack_1e0 = (float  [2])uVar86;
              afStack_1d8 = (float  [2])uVar87;
              afStack_1d0 = (float  [2])uVar88;
              afStack_1c8._0_8_ = uVar89;
              local_200._0_8_ = uVar83;
              local_200._8_8_ = uVar82;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                        (&local_27b,(__m512 *)local_200,(__m512 *)local_140);
              *(undefined8 *)pfVar51 = uVar83;
              *(undefined8 *)(pfVar51 + 2) = uVar82;
              *(undefined8 *)(pfVar51 + 4) = uVar84;
              *(undefined8 *)(pfVar51 + 6) = uVar85;
              *(undefined8 *)(pfVar51 + 8) = uVar86;
              *(undefined8 *)(pfVar51 + 10) = uVar87;
              *(undefined8 *)(pfVar51 + 0xc) = uVar88;
              *(undefined8 *)(pfVar51 + 0xe) = uVar89;
              pfVar52 = pfVar52 + 0x10;
              pfVar51 = pfVar51 + 0x10;
              uVar46 = uVar42 + 0x10;
              iVar50 = uVar42 + 0x1f;
              uVar42 = uVar46;
              afStack_1e0 = (float  [2])uVar86;
              afStack_1d8 = (float  [2])uVar87;
              afStack_1d0 = (float  [2])uVar88;
              afStack_1c8._0_8_ = uVar89;
            } while (iVar50 < iVar45);
          }
          auVar93 = _local_180;
          local_200 = local_180;
          afStack_1f0[0] = afStack_170[0];
          afStack_1f0[1] = afStack_170[1];
          afStack_1e8[0] = afStack_168[0];
          afStack_1e8[1] = afStack_168[1];
          _local_180 = auVar93;
          if ((int)(uVar46 | 7) < iVar45) {
            uVar42 = uVar46;
            do {
              uVar83 = *(undefined8 *)pfVar52;
              uVar82 = *(undefined8 *)(pfVar52 + 2);
              uVar84 = *(undefined8 *)(pfVar52 + 4);
              uVar85 = *(undefined8 *)(pfVar52 + 6);
              local_240 = (float  [2])uVar83;
              afStack_238 = (float  [2])uVar82;
              afStack_230 = (float  [2])uVar84;
              afStack_228._0_8_ = uVar85;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                        (&local_27b,(__m256 *)local_240,(__m256 *)local_200);
              *(undefined8 *)pfVar51 = uVar83;
              *(undefined8 *)(pfVar51 + 2) = uVar82;
              *(undefined8 *)(pfVar51 + 4) = uVar84;
              *(undefined8 *)(pfVar51 + 6) = uVar85;
              pfVar52 = pfVar52 + 8;
              pfVar51 = pfVar51 + 8;
              uVar46 = uVar42 + 8;
              iVar50 = uVar42 + 0xf;
              uVar42 = uVar46;
              afStack_230 = (float  [2])uVar84;
              afStack_228._0_8_ = uVar85;
            } while (iVar50 < iVar45);
          }
          uVar42 = uVar46 | 3;
          local_240 = (float  [2])local_180._0_8_;
          afStack_238 = (float  [2])local_180._8_8_;
          while ((int)uVar42 < iVar45) {
            local_260 = *(binary_op_ratan2 (*) [8])pfVar52;
            uVar83 = *(undefined8 *)(pfVar52 + 2);
            afStack_258 = (float  [2])uVar83;
            afVar100 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                 (&local_27b,(__m128 *)local_260,(__m128 *)local_240);
            local_260 = afVar100._0_8_;
            *(binary_op_ratan2 (*) [8])pfVar51 = local_260;
            *(undefined8 *)(pfVar51 + 2) = uVar83;
            pfVar52 = pfVar52 + 4;
            pfVar51 = pfVar51 + 4;
            uVar42 = uVar46 + 7;
            uVar46 = uVar46 + 4;
            afStack_258 = (float  [2])uVar83;
          }
          if ((int)uVar46 < iVar45) {
            lVar49 = 0;
            do {
              fVar78 = powf((float)local_190._0_4_,pfVar52[lVar49]);
              pfVar51[lVar49] = fVar78;
              lVar49 = lVar49 + 1;
            } while (iVar45 - uVar46 != (int)lVar49);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_278);
      }
      break;
    case 10:
      local_278 = (long)m->c;
      if (0 < local_278) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        auVar56 = vbroadcastss_avx512f(auVar98);
        auVar93 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar55._8_4_ = 0x80000000;
        auVar55._0_8_ = 0x8000000080000000;
        auVar55._12_4_ = 0x80000000;
        auVar55._16_4_ = 0x80000000;
        auVar55._20_4_ = 0x80000000;
        auVar55._24_4_ = 0x80000000;
        auVar55._28_4_ = 0x80000000;
        auVar55._32_4_ = 0x80000000;
        auVar55._36_4_ = 0x80000000;
        auVar55._40_4_ = 0x80000000;
        auVar55._44_4_ = 0x80000000;
        auVar55._48_4_ = 0x80000000;
        auVar55._52_4_ = 0x80000000;
        auVar55._56_4_ = 0x80000000;
        auVar55._60_4_ = 0x80000000;
        auVar93 = vpternlogd_avx512f(auVar93,auVar56,auVar55,0xf8);
        auVar74 = ZEXT864(0);
        uVar53 = vcmpps_avx512f(auVar93,auVar74,1);
        auVar93 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        local_c0._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * auVar93._4_4_;
        local_c0._0_4_ = (uint)((byte)uVar53 & 1) * auVar93._0_4_;
        local_c0._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * auVar93._8_4_;
        local_c0._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * auVar93._12_4_;
        local_c0._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * auVar93._16_4_;
        local_c0._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * auVar93._20_4_;
        local_c0._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * auVar93._24_4_;
        local_c0._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * auVar93._28_4_;
        local_c0._32_4_ = (uint)((byte)(uVar53 >> 8) & 1) * auVar93._32_4_;
        local_c0._36_4_ = (uint)((byte)(uVar53 >> 9) & 1) * auVar93._36_4_;
        local_c0._40_4_ = (uint)((byte)(uVar53 >> 10) & 1) * auVar93._40_4_;
        local_c0._44_4_ = (uint)((byte)(uVar53 >> 0xb) & 1) * auVar93._44_4_;
        local_c0._48_4_ = (uint)((byte)(uVar53 >> 0xc) & 1) * auVar93._48_4_;
        local_c0._52_4_ = (uint)((byte)(uVar53 >> 0xd) & 1) * auVar93._52_4_;
        local_c0._56_4_ = (uint)((byte)(uVar53 >> 0xe) & 1) * auVar93._56_4_;
        local_c0._60_4_ = (uint)(byte)(uVar53 >> 0xf) * auVar93._60_4_;
        local_204 = uVar46 & 0xfffffff0;
        auVar81._0_4_ = 1.0 / fVar78;
        auVar81._4_12_ = SUB6012((undefined1  [60])0x0,0);
        local_100 = vbroadcastss_avx512f(auVar81);
        local_270 = 0;
        uVar53 = vcmpps_avx512f(auVar56,auVar74,1);
        uVar54 = vcmpps_avx512f(auVar56,auVar74,4);
        auVar93 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar55 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar57 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar59 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar60 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar61 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar62 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar63 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar64 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar65 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar66 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar67 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar99 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        local_27a = (ushort)uVar53;
        local_264 = CONCAT22(local_264._2_2_,(short)uVar54);
        _local_180 = auVar56;
        do {
          pauVar44 = (undefined1 (*) [64])
                     (local_248->cstep * local_270 * local_248->elemsize + (long)local_248->data);
          pfVar51 = (float *)(local_250->cstep * local_270 * local_250->elemsize +
                             (long)local_250->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar45 = 0xf;
            auVar68 = auVar56;
            do {
              auVar69 = *pauVar44;
              uVar39 = vcmpps_avx512f(auVar69,auVar74,1);
              auVar71._8_4_ = 0xc0490fdb;
              auVar71._0_8_ = 0xc0490fdbc0490fdb;
              auVar71._12_4_ = 0xc0490fdb;
              auVar71._16_4_ = 0xc0490fdb;
              auVar71._20_4_ = 0xc0490fdb;
              auVar71._24_4_ = 0xc0490fdb;
              auVar71._28_4_ = 0xc0490fdb;
              auVar71._32_4_ = 0xc0490fdb;
              auVar71._36_4_ = 0xc0490fdb;
              auVar71._40_4_ = 0xc0490fdb;
              auVar71._44_4_ = 0xc0490fdb;
              auVar71._48_4_ = 0xc0490fdb;
              auVar71._52_4_ = 0xc0490fdb;
              auVar71._56_4_ = 0xc0490fdb;
              auVar71._60_4_ = 0xc0490fdb;
              auVar70 = vblendmps_avx512f(auVar55,auVar71);
              bVar5 = (bool)((byte)uVar39 & 1);
              auVar56._0_4_ = (uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar68._0_4_;
              bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
              auVar56._4_4_ = (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * auVar68._4_4_;
              bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
              auVar56._8_4_ = (uint)bVar5 * auVar70._8_4_ | (uint)!bVar5 * auVar68._8_4_;
              bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
              auVar56._12_4_ = (uint)bVar5 * auVar70._12_4_ | (uint)!bVar5 * auVar68._12_4_;
              bVar5 = (bool)((byte)(uVar39 >> 4) & 1);
              auVar56._16_4_ = (uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * auVar68._16_4_;
              bVar5 = (bool)((byte)(uVar39 >> 5) & 1);
              auVar56._20_4_ = (uint)bVar5 * auVar70._20_4_ | (uint)!bVar5 * auVar68._20_4_;
              bVar5 = (bool)((byte)(uVar39 >> 6) & 1);
              auVar56._24_4_ = (uint)bVar5 * auVar70._24_4_ | (uint)!bVar5 * auVar68._24_4_;
              bVar5 = (bool)((byte)(uVar39 >> 7) & 1);
              auVar56._28_4_ = (uint)bVar5 * auVar70._28_4_ | (uint)!bVar5 * auVar68._28_4_;
              bVar5 = (bool)((byte)(uVar39 >> 8) & 1);
              auVar56._32_4_ = (uint)bVar5 * auVar70._32_4_ | (uint)!bVar5 * auVar68._32_4_;
              bVar5 = (bool)((byte)(uVar39 >> 9) & 1);
              auVar56._36_4_ = (uint)bVar5 * auVar70._36_4_ | (uint)!bVar5 * auVar68._36_4_;
              bVar5 = (bool)((byte)(uVar39 >> 10) & 1);
              auVar56._40_4_ = (uint)bVar5 * auVar70._40_4_ | (uint)!bVar5 * auVar68._40_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xb) & 1);
              auVar56._44_4_ = (uint)bVar5 * auVar70._44_4_ | (uint)!bVar5 * auVar68._44_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xc) & 1);
              auVar56._48_4_ = (uint)bVar5 * auVar70._48_4_ | (uint)!bVar5 * auVar68._48_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xd) & 1);
              auVar56._52_4_ = (uint)bVar5 * auVar70._52_4_ | (uint)!bVar5 * auVar68._52_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xe) & 1);
              auVar56._56_4_ = (uint)bVar5 * auVar70._56_4_ | (uint)!bVar5 * auVar68._56_4_;
              bVar5 = SUB81(uVar39 >> 0xf,0);
              auVar56._60_4_ = (uint)bVar5 * auVar70._60_4_ | (uint)!bVar5 * auVar68._60_4_;
              auVar68 = vmulps_avx512f(auVar69,local_100);
              auVar70 = vandps_avx512dq(auVar68,auVar57);
              uVar39 = vcmpps_avx512f(auVar58,auVar70,1);
              auVar71 = vmaxps_avx512f(auVar70,auVar58);
              auVar73._8_4_ = 0xbf800000;
              auVar73._0_8_ = 0xbf800000bf800000;
              auVar73._12_4_ = 0xbf800000;
              auVar73._16_4_ = 0xbf800000;
              auVar73._20_4_ = 0xbf800000;
              auVar73._24_4_ = 0xbf800000;
              auVar73._28_4_ = 0xbf800000;
              auVar73._32_4_ = 0xbf800000;
              auVar73._36_4_ = 0xbf800000;
              auVar73._40_4_ = 0xbf800000;
              auVar73._44_4_ = 0xbf800000;
              auVar73._48_4_ = 0xbf800000;
              auVar73._52_4_ = 0xbf800000;
              auVar73._56_4_ = 0xbf800000;
              auVar73._60_4_ = 0xbf800000;
              auVar72 = vblendmps_avx512f(auVar70,auVar73);
              bVar5 = (bool)((byte)uVar39 & 1);
              auVar75._0_4_ = (uint)bVar5 * auVar72._0_4_ | (uint)!bVar5 * auVar70._0_4_;
              bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
              auVar75._4_4_ = (uint)bVar5 * auVar72._4_4_ | (uint)!bVar5 * auVar70._4_4_;
              bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
              auVar75._8_4_ = (uint)bVar5 * auVar72._8_4_ | (uint)!bVar5 * auVar70._8_4_;
              bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
              auVar75._12_4_ = (uint)bVar5 * auVar72._12_4_ | (uint)!bVar5 * auVar70._12_4_;
              bVar5 = (bool)((byte)(uVar39 >> 4) & 1);
              auVar75._16_4_ = (uint)bVar5 * auVar72._16_4_ | (uint)!bVar5 * auVar70._16_4_;
              bVar5 = (bool)((byte)(uVar39 >> 5) & 1);
              auVar75._20_4_ = (uint)bVar5 * auVar72._20_4_ | (uint)!bVar5 * auVar70._20_4_;
              bVar5 = (bool)((byte)(uVar39 >> 6) & 1);
              auVar75._24_4_ = (uint)bVar5 * auVar72._24_4_ | (uint)!bVar5 * auVar70._24_4_;
              bVar5 = (bool)((byte)(uVar39 >> 7) & 1);
              auVar75._28_4_ = (uint)bVar5 * auVar72._28_4_ | (uint)!bVar5 * auVar70._28_4_;
              bVar21 = (byte)(uVar39 >> 8);
              bVar5 = (bool)(bVar21 & 1);
              auVar75._32_4_ = (uint)bVar5 * auVar72._32_4_ | (uint)!bVar5 * auVar70._32_4_;
              bVar5 = (bool)((byte)(uVar39 >> 9) & 1);
              auVar75._36_4_ = (uint)bVar5 * auVar72._36_4_ | (uint)!bVar5 * auVar70._36_4_;
              bVar5 = (bool)((byte)(uVar39 >> 10) & 1);
              auVar75._40_4_ = (uint)bVar5 * auVar72._40_4_ | (uint)!bVar5 * auVar70._40_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xb) & 1);
              auVar75._44_4_ = (uint)bVar5 * auVar72._44_4_ | (uint)!bVar5 * auVar70._44_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xc) & 1);
              auVar75._48_4_ = (uint)bVar5 * auVar72._48_4_ | (uint)!bVar5 * auVar70._48_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xd) & 1);
              auVar75._52_4_ = (uint)bVar5 * auVar72._52_4_ | (uint)!bVar5 * auVar70._52_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xe) & 1);
              auVar75._56_4_ = (uint)bVar5 * auVar72._56_4_ | (uint)!bVar5 * auVar70._56_4_;
              bVar5 = SUB81(uVar39 >> 0xf,0);
              auVar75._60_4_ = (uint)bVar5 * auVar72._60_4_ | (uint)!bVar5 * auVar70._60_4_;
              auVar70 = vrcp14ps_avx512f(auVar71);
              auVar72 = vmulps_avx512f(auVar75,auVar70);
              auVar71 = vfmsub213ps_avx512f(auVar71,auVar72,auVar75);
              auVar70 = vfnmadd213ps_avx512f(auVar71,auVar70,auVar72);
              auVar71 = vmulps_avx512f(auVar70,auVar70);
              auVar72 = vmulps_avx512f(auVar71,auVar71);
              auVar73 = vfmadd213ps_avx512f(auVar59,auVar72,auVar60);
              auVar73 = vfmadd213ps_avx512f(auVar73,auVar72,auVar61);
              auVar75 = vfmadd213ps_avx512f(auVar63,auVar72,auVar64);
              auVar75 = vfmadd213ps_avx512f(auVar75,auVar72,auVar65);
              auVar75 = vfmadd213ps_avx512f(auVar75,auVar72,auVar66);
              auVar73 = vfmadd213ps_avx512f(auVar73,auVar72,auVar62);
              auVar72 = vfmadd213ps_avx512f(auVar75,auVar72,auVar58);
              auVar71 = vfmadd231ps_avx512f(auVar72,auVar71,auVar73);
              auVar70 = vmulps_avx512f(auVar71,auVar70);
              uVar40 = vcmpps_avx512f(auVar69,auVar74,4);
              auVar71 = vaddps_avx512f(auVar70,auVar67);
              bVar5 = (bool)((byte)uVar39 & 1);
              auVar76._0_4_ = (uint)bVar5 * auVar71._0_4_ | (uint)!bVar5 * auVar70._0_4_;
              bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
              auVar76._4_4_ = (uint)bVar5 * auVar71._4_4_ | (uint)!bVar5 * auVar70._4_4_;
              bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
              auVar76._8_4_ = (uint)bVar5 * auVar71._8_4_ | (uint)!bVar5 * auVar70._8_4_;
              bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
              auVar76._12_4_ = (uint)bVar5 * auVar71._12_4_ | (uint)!bVar5 * auVar70._12_4_;
              bVar5 = (bool)((byte)(uVar39 >> 4) & 1);
              auVar76._16_4_ = (uint)bVar5 * auVar71._16_4_ | (uint)!bVar5 * auVar70._16_4_;
              bVar5 = (bool)((byte)(uVar39 >> 5) & 1);
              auVar76._20_4_ = (uint)bVar5 * auVar71._20_4_ | (uint)!bVar5 * auVar70._20_4_;
              bVar5 = (bool)((byte)(uVar39 >> 6) & 1);
              auVar76._24_4_ = (uint)bVar5 * auVar71._24_4_ | (uint)!bVar5 * auVar70._24_4_;
              bVar5 = (bool)((byte)(uVar39 >> 7) & 1);
              auVar76._28_4_ = (uint)bVar5 * auVar71._28_4_ | (uint)!bVar5 * auVar70._28_4_;
              bVar5 = (bool)(bVar21 & 1);
              auVar76._32_4_ = (uint)bVar5 * auVar71._32_4_ | (uint)!bVar5 * auVar70._32_4_;
              bVar5 = (bool)((byte)(uVar39 >> 9) & 1);
              auVar76._36_4_ = (uint)bVar5 * auVar71._36_4_ | (uint)!bVar5 * auVar70._36_4_;
              bVar5 = (bool)((byte)(uVar39 >> 10) & 1);
              auVar76._40_4_ = (uint)bVar5 * auVar71._40_4_ | (uint)!bVar5 * auVar70._40_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xb) & 1);
              auVar76._44_4_ = (uint)bVar5 * auVar71._44_4_ | (uint)!bVar5 * auVar70._44_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xc) & 1);
              auVar76._48_4_ = (uint)bVar5 * auVar71._48_4_ | (uint)!bVar5 * auVar70._48_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xd) & 1);
              auVar76._52_4_ = (uint)bVar5 * auVar71._52_4_ | (uint)!bVar5 * auVar70._52_4_;
              bVar5 = (bool)((byte)(uVar39 >> 0xe) & 1);
              auVar76._56_4_ = (uint)bVar5 * auVar71._56_4_ | (uint)!bVar5 * auVar70._56_4_;
              bVar5 = SUB81(uVar39 >> 0xf,0);
              auVar76._60_4_ = (uint)bVar5 * auVar71._60_4_ | (uint)!bVar5 * auVar70._60_4_;
              auVar68 = vpternlogd_avx512f(auVar76,auVar68,auVar93,0xf8);
              auVar70 = vaddps_avx512f(auVar68,auVar56);
              bVar5 = (bool)((byte)uVar53 & 1);
              bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar53 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar53 >> 6) & 1);
              bVar13 = (bool)((byte)(uVar53 >> 7) & 1);
              bVar14 = (bool)((byte)(uVar53 >> 8) & 1);
              bVar15 = (bool)((byte)(uVar53 >> 9) & 1);
              bVar16 = (bool)((byte)(uVar53 >> 10) & 1);
              bVar17 = (bool)((byte)(uVar53 >> 0xb) & 1);
              bVar18 = (bool)((byte)(uVar53 >> 0xc) & 1);
              bVar19 = (bool)((byte)(uVar53 >> 0xd) & 1);
              bVar20 = (bool)((byte)(uVar53 >> 0xe) & 1);
              bVar22 = SUB81(uVar53 >> 0xf,0);
              auVar69 = vpternlogd_avx512f(auVar69,auVar93,auVar99,0xea);
              bVar6 = (bool)((byte)uVar54 & 1);
              auVar77._0_4_ =
                   (uint)bVar6 * ((uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar68._0_4_) |
                   (uint)!bVar6 * auVar69._0_4_;
              bVar5 = (bool)((byte)(uVar54 >> 1) & 1);
              auVar77._4_4_ =
                   (uint)bVar5 * ((uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * auVar68._4_4_) |
                   (uint)!bVar5 * auVar69._4_4_;
              bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
              auVar77._8_4_ =
                   (uint)bVar5 * ((uint)bVar8 * auVar70._8_4_ | (uint)!bVar8 * auVar68._8_4_) |
                   (uint)!bVar5 * auVar69._8_4_;
              bVar5 = (bool)((byte)(uVar54 >> 3) & 1);
              auVar77._12_4_ =
                   (uint)bVar5 * ((uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * auVar68._12_4_) |
                   (uint)!bVar5 * auVar69._12_4_;
              bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
              auVar77._16_4_ =
                   (uint)bVar5 * ((uint)bVar10 * auVar70._16_4_ | (uint)!bVar10 * auVar68._16_4_) |
                   (uint)!bVar5 * auVar69._16_4_;
              bVar5 = (bool)((byte)(uVar54 >> 5) & 1);
              auVar77._20_4_ =
                   (uint)bVar5 * ((uint)bVar11 * auVar70._20_4_ | (uint)!bVar11 * auVar68._20_4_) |
                   (uint)!bVar5 * auVar69._20_4_;
              bVar5 = (bool)((byte)(uVar54 >> 6) & 1);
              auVar77._24_4_ =
                   (uint)bVar5 * ((uint)bVar12 * auVar70._24_4_ | (uint)!bVar12 * auVar68._24_4_) |
                   (uint)!bVar5 * auVar69._24_4_;
              bVar5 = (bool)((byte)(uVar54 >> 7) & 1);
              auVar77._28_4_ =
                   (uint)bVar5 * ((uint)bVar13 * auVar70._28_4_ | (uint)!bVar13 * auVar68._28_4_) |
                   (uint)!bVar5 * auVar69._28_4_;
              bVar5 = (bool)((byte)(uVar54 >> 8) & 1);
              auVar77._32_4_ =
                   (uint)bVar5 * ((uint)bVar14 * auVar70._32_4_ | (uint)!bVar14 * auVar68._32_4_) |
                   (uint)!bVar5 * auVar69._32_4_;
              bVar5 = (bool)((byte)(uVar54 >> 9) & 1);
              auVar77._36_4_ =
                   (uint)bVar5 * ((uint)bVar15 * auVar70._36_4_ | (uint)!bVar15 * auVar68._36_4_) |
                   (uint)!bVar5 * auVar69._36_4_;
              bVar5 = (bool)((byte)(uVar54 >> 10) & 1);
              auVar77._40_4_ =
                   (uint)bVar5 * ((uint)bVar16 * auVar70._40_4_ | (uint)!bVar16 * auVar68._40_4_) |
                   (uint)!bVar5 * auVar69._40_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xb) & 1);
              auVar77._44_4_ =
                   (uint)bVar5 * ((uint)bVar17 * auVar70._44_4_ | (uint)!bVar17 * auVar68._44_4_) |
                   (uint)!bVar5 * auVar69._44_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xc) & 1);
              auVar77._48_4_ =
                   (uint)bVar5 * ((uint)bVar18 * auVar70._48_4_ | (uint)!bVar18 * auVar68._48_4_) |
                   (uint)!bVar5 * auVar69._48_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xd) & 1);
              auVar77._52_4_ =
                   (uint)bVar5 * ((uint)bVar19 * auVar70._52_4_ | (uint)!bVar19 * auVar68._52_4_) |
                   (uint)!bVar5 * auVar69._52_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xe) & 1);
              auVar77._56_4_ =
                   (uint)bVar5 * ((uint)bVar20 * auVar70._56_4_ | (uint)!bVar20 * auVar68._56_4_) |
                   (uint)!bVar5 * auVar69._56_4_;
              bVar5 = SUB81(uVar54 >> 0xf,0);
              auVar77._60_4_ =
                   (uint)bVar5 * ((uint)bVar22 * auVar70._60_4_ | (uint)!bVar22 * auVar68._60_4_) |
                   (uint)!bVar5 * auVar69._60_4_;
              auVar68 = vblendmps_avx512f(local_c0,auVar77);
              bVar5 = (bool)((byte)uVar40 & 1);
              bVar6 = (bool)((byte)(uVar40 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar40 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar40 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar40 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar40 >> 6) & 1);
              bVar12 = (bool)((byte)(uVar40 >> 7) & 1);
              bVar13 = (bool)((byte)(uVar40 >> 8) & 1);
              bVar14 = (bool)((byte)(uVar40 >> 9) & 1);
              bVar15 = (bool)((byte)(uVar40 >> 10) & 1);
              bVar16 = (bool)((byte)(uVar40 >> 0xb) & 1);
              bVar17 = (bool)((byte)(uVar40 >> 0xc) & 1);
              bVar18 = (bool)((byte)(uVar40 >> 0xd) & 1);
              bVar19 = (bool)((byte)(uVar40 >> 0xe) & 1);
              bVar20 = SUB81(uVar40 >> 0xf,0);
              *pfVar51 = (float)((uint)bVar5 * auVar68._0_4_ | !bVar5 * auVar77._0_4_);
              pfVar51[1] = (float)((uint)bVar6 * auVar68._4_4_ | !bVar6 * auVar77._4_4_);
              pfVar51[2] = (float)((uint)bVar7 * auVar68._8_4_ | !bVar7 * auVar77._8_4_);
              pfVar51[3] = (float)((uint)bVar8 * auVar68._12_4_ | !bVar8 * auVar77._12_4_);
              pfVar51[4] = (float)((uint)bVar9 * auVar68._16_4_ | !bVar9 * auVar77._16_4_);
              pfVar51[5] = (float)((uint)bVar10 * auVar68._20_4_ | !bVar10 * auVar77._20_4_);
              pfVar51[6] = (float)((uint)bVar11 * auVar68._24_4_ | !bVar11 * auVar77._24_4_);
              pfVar51[7] = (float)((uint)bVar12 * auVar68._28_4_ | !bVar12 * auVar77._28_4_);
              pfVar51[8] = (float)((uint)bVar13 * auVar68._32_4_ | !bVar13 * auVar77._32_4_);
              pfVar51[9] = (float)((uint)bVar14 * auVar68._36_4_ | !bVar14 * auVar77._36_4_);
              pfVar51[10] = (float)((uint)bVar15 * auVar68._40_4_ | !bVar15 * auVar77._40_4_);
              pfVar51[0xb] = (float)((uint)bVar16 * auVar68._44_4_ | !bVar16 * auVar77._44_4_);
              pfVar51[0xc] = (float)((uint)bVar17 * auVar68._48_4_ | !bVar17 * auVar77._48_4_);
              pfVar51[0xd] = (float)((uint)bVar18 * auVar68._52_4_ | !bVar18 * auVar77._52_4_);
              pfVar51[0xe] = (float)((uint)bVar19 * auVar68._56_4_ | !bVar19 * auVar77._56_4_);
              pfVar51[0xf] = (float)((uint)bVar20 * auVar68._60_4_ | !bVar20 * auVar77._60_4_);
              pauVar44 = pauVar44 + 1;
              pfVar51 = pfVar51 + 0x10;
              iVar45 = iVar45 + 0x10;
              auVar68 = auVar56;
              uVar42 = local_204;
            } while (iVar45 < (int)uVar46);
          }
          local_140 = local_180._0_32_;
          if ((int)(uVar42 | 7) < (int)uVar46) {
            uVar43 = uVar42;
            do {
              uVar83 = *(undefined8 *)*pauVar44;
              uVar82 = *(undefined8 *)(*pauVar44 + 8);
              uVar84 = *(undefined8 *)(*pauVar44 + 0x10);
              uVar85 = *(undefined8 *)(*pauVar44 + 0x18);
              afStack_1f0 = (float  [2])uVar84;
              afStack_1e8 = (float  [2])uVar85;
              local_200._0_8_ = uVar83;
              local_200._8_8_ = uVar82;
              BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)local_260,(__m256 *)local_200,&local_140);
              *(undefined8 *)pfVar51 = uVar83;
              *(undefined8 *)(pfVar51 + 2) = uVar82;
              *(undefined8 *)(pfVar51 + 4) = uVar84;
              *(undefined8 *)(pfVar51 + 6) = uVar85;
              pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
              pfVar51 = pfVar51 + 8;
              uVar42 = uVar43 + 8;
              iVar45 = uVar43 + 0xf;
              uVar43 = uVar42;
              afStack_1f0 = (float  [2])uVar84;
              afStack_1e8 = (float  [2])uVar85;
            } while (iVar45 < (int)uVar46);
          }
          local_200 = local_180;
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            local_240 = *(float (*) [2])*pauVar44;
            uVar83 = *(undefined8 *)(*pauVar44 + 8);
            auVar94 = ZEXT856(auVar56._8_8_);
            afStack_238 = (float  [2])uVar83;
            afVar100 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                 ((binary_op_atan2 *)local_260,(__m128 *)local_240,&local_200);
            auVar56._0_8_ = afVar100._8_8_;
            auVar56._8_56_ = auVar94;
            local_240 = afVar100._0_8_;
            *(float (*) [2])pfVar51 = local_240;
            *(undefined8 *)(pfVar51 + 2) = uVar83;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pfVar51 = pfVar51 + 4;
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
            afStack_238 = (float  [2])uVar83;
          }
          if ((int)uVar42 < (int)uVar46) {
            lVar49 = 0;
            do {
              auVar56 = ZEXT1664(local_190);
              fVar78 = atan2f(*(float *)(*pauVar44 + lVar49 * 4),local_190._0_4_);
              pfVar51[lVar49] = fVar78;
              lVar49 = lVar49 + 1;
            } while (uVar46 - uVar42 != (int)lVar49);
          }
          local_270 = local_270 + 1;
          auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar53 = (ulong)local_27a;
          uVar54 = (ulong)(ushort)local_264;
          auVar93 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar55 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar57 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar59 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar60 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar61 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar62 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar63 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar64 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar65 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar66 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar67 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar99 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        } while (local_270 != local_278);
      }
      break;
    case 0xb:
      local_278 = (long)m->c;
      if (0 < local_278) {
        uVar46 = m->h * m->w * m->d * m->elempack;
        _local_180 = vbroadcastss_avx512f(local_190);
        auVar99 = ZEXT864(0);
        uVar53 = vcmpps_avx512f(_local_180,auVar99,1);
        auVar93 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar55 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
        bVar5 = (bool)((byte)uVar53 & 1);
        local_c0._0_4_ = (uint)bVar5 * auVar55._0_4_ | (uint)!bVar5 * auVar93._0_4_;
        bVar5 = (bool)((byte)(uVar53 >> 1) & 1);
        local_c0._4_4_ = (uint)bVar5 * auVar55._4_4_ | (uint)!bVar5 * auVar93._4_4_;
        bVar5 = (bool)((byte)(uVar53 >> 2) & 1);
        local_c0._8_4_ = (uint)bVar5 * auVar55._8_4_ | (uint)!bVar5 * auVar93._8_4_;
        bVar5 = (bool)((byte)(uVar53 >> 3) & 1);
        local_c0._12_4_ = (uint)bVar5 * auVar55._12_4_ | (uint)!bVar5 * auVar93._12_4_;
        bVar5 = (bool)((byte)(uVar53 >> 4) & 1);
        local_c0._16_4_ = (uint)bVar5 * auVar55._16_4_ | (uint)!bVar5 * auVar93._16_4_;
        bVar5 = (bool)((byte)(uVar53 >> 5) & 1);
        local_c0._20_4_ = (uint)bVar5 * auVar55._20_4_ | (uint)!bVar5 * auVar93._20_4_;
        bVar5 = (bool)((byte)(uVar53 >> 6) & 1);
        local_c0._24_4_ = (uint)bVar5 * auVar55._24_4_ | (uint)!bVar5 * auVar93._24_4_;
        bVar5 = (bool)((byte)(uVar53 >> 7) & 1);
        local_c0._28_4_ = (uint)bVar5 * auVar55._28_4_ | (uint)!bVar5 * auVar93._28_4_;
        bVar5 = (bool)((byte)(uVar53 >> 8) & 1);
        local_c0._32_4_ = (uint)bVar5 * auVar55._32_4_ | (uint)!bVar5 * auVar93._32_4_;
        bVar5 = (bool)((byte)(uVar53 >> 9) & 1);
        local_c0._36_4_ = (uint)bVar5 * auVar55._36_4_ | (uint)!bVar5 * auVar93._36_4_;
        bVar5 = (bool)((byte)(uVar53 >> 10) & 1);
        local_c0._40_4_ = (uint)bVar5 * auVar55._40_4_ | (uint)!bVar5 * auVar93._40_4_;
        bVar5 = (bool)((byte)(uVar53 >> 0xb) & 1);
        local_c0._44_4_ = (uint)bVar5 * auVar55._44_4_ | (uint)!bVar5 * auVar93._44_4_;
        bVar5 = (bool)((byte)(uVar53 >> 0xc) & 1);
        local_c0._48_4_ = (uint)bVar5 * auVar55._48_4_ | (uint)!bVar5 * auVar93._48_4_;
        bVar5 = (bool)((byte)(uVar53 >> 0xd) & 1);
        local_c0._52_4_ = (uint)bVar5 * auVar55._52_4_ | (uint)!bVar5 * auVar93._52_4_;
        bVar5 = (bool)((byte)(uVar53 >> 0xe) & 1);
        local_c0._56_4_ = (uint)bVar5 * auVar55._56_4_ | (uint)!bVar5 * auVar93._56_4_;
        bVar5 = SUB81(uVar53 >> 0xf,0);
        local_c0._60_4_ = (uint)bVar5 * auVar55._60_4_ | (uint)!bVar5 * auVar93._60_4_;
        auVar55 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000080000000;
        auVar93._12_4_ = 0x80000000;
        auVar93._16_4_ = 0x80000000;
        auVar93._20_4_ = 0x80000000;
        auVar93._24_4_ = 0x80000000;
        auVar93._28_4_ = 0x80000000;
        auVar93._32_4_ = 0x80000000;
        auVar93._36_4_ = 0x80000000;
        auVar93._40_4_ = 0x80000000;
        auVar93._44_4_ = 0x80000000;
        auVar93._48_4_ = 0x80000000;
        auVar93._52_4_ = 0x80000000;
        auVar93._56_4_ = 0x80000000;
        auVar93._60_4_ = 0x80000000;
        auVar93 = vpternlogd_avx512f(auVar55,_local_180,auVar93,0xf8);
        local_264 = uVar46 & 0xfffffff0;
        local_270 = 0;
        uVar53 = vcmpps_avx512f(_local_180,auVar99,4);
        auVar55 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar56 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar57 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar58 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar59 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar60 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar61 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar62 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar63 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar64 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar65 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar66 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar67 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        local_100 = vmovdqa64_avx512f(auVar93);
        local_27a = (ushort)uVar53;
        do {
          pauVar44 = (undefined1 (*) [64])
                     (local_248->cstep * local_270 * local_248->elemsize + (long)local_248->data);
          pfVar51 = (float *)(local_250->cstep * local_270 * local_250->elemsize +
                             (long)local_250->data);
          if ((int)uVar46 < 0x10) {
            uVar42 = 0;
          }
          else {
            iVar45 = 0xf;
            do {
              auVar74 = *pauVar44;
              auVar68 = vrcp14ps_avx512f(auVar74);
              auVar69 = vmulps_avx512f(_local_180,auVar68);
              auVar70 = vfmsub213ps_avx512f(auVar69,auVar74,_local_180);
              auVar69 = vfnmadd213ps_avx512f(auVar70,auVar68,auVar69);
              auVar70 = vandps_avx512dq(auVar69,auVar56);
              uVar54 = vcmpps_avx512f(auVar57,auVar70,1);
              auVar71 = vmaxps_avx512f(auVar70,auVar57);
              auVar68._8_4_ = 0xbf800000;
              auVar68._0_8_ = 0xbf800000bf800000;
              auVar68._12_4_ = 0xbf800000;
              auVar68._16_4_ = 0xbf800000;
              auVar68._20_4_ = 0xbf800000;
              auVar68._24_4_ = 0xbf800000;
              auVar68._28_4_ = 0xbf800000;
              auVar68._32_4_ = 0xbf800000;
              auVar68._36_4_ = 0xbf800000;
              auVar68._40_4_ = 0xbf800000;
              auVar68._44_4_ = 0xbf800000;
              auVar68._48_4_ = 0xbf800000;
              auVar68._52_4_ = 0xbf800000;
              auVar68._56_4_ = 0xbf800000;
              auVar68._60_4_ = 0xbf800000;
              auVar68 = vblendmps_avx512f(auVar70,auVar68);
              bVar5 = (bool)((byte)uVar54 & 1);
              auVar72._0_4_ = (uint)bVar5 * auVar68._0_4_ | (uint)!bVar5 * auVar70._0_4_;
              bVar5 = (bool)((byte)(uVar54 >> 1) & 1);
              auVar72._4_4_ = (uint)bVar5 * auVar68._4_4_ | (uint)!bVar5 * auVar70._4_4_;
              bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
              auVar72._8_4_ = (uint)bVar5 * auVar68._8_4_ | (uint)!bVar5 * auVar70._8_4_;
              bVar5 = (bool)((byte)(uVar54 >> 3) & 1);
              auVar72._12_4_ = (uint)bVar5 * auVar68._12_4_ | (uint)!bVar5 * auVar70._12_4_;
              bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
              auVar72._16_4_ = (uint)bVar5 * auVar68._16_4_ | (uint)!bVar5 * auVar70._16_4_;
              bVar5 = (bool)((byte)(uVar54 >> 5) & 1);
              auVar72._20_4_ = (uint)bVar5 * auVar68._20_4_ | (uint)!bVar5 * auVar70._20_4_;
              bVar5 = (bool)((byte)(uVar54 >> 6) & 1);
              auVar72._24_4_ = (uint)bVar5 * auVar68._24_4_ | (uint)!bVar5 * auVar70._24_4_;
              bVar5 = (bool)((byte)(uVar54 >> 7) & 1);
              auVar72._28_4_ = (uint)bVar5 * auVar68._28_4_ | (uint)!bVar5 * auVar70._28_4_;
              bVar21 = (byte)(uVar54 >> 8);
              bVar5 = (bool)(bVar21 & 1);
              auVar72._32_4_ = (uint)bVar5 * auVar68._32_4_ | (uint)!bVar5 * auVar70._32_4_;
              bVar5 = (bool)((byte)(uVar54 >> 9) & 1);
              auVar72._36_4_ = (uint)bVar5 * auVar68._36_4_ | (uint)!bVar5 * auVar70._36_4_;
              bVar5 = (bool)((byte)(uVar54 >> 10) & 1);
              auVar72._40_4_ = (uint)bVar5 * auVar68._40_4_ | (uint)!bVar5 * auVar70._40_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xb) & 1);
              auVar72._44_4_ = (uint)bVar5 * auVar68._44_4_ | (uint)!bVar5 * auVar70._44_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xc) & 1);
              auVar72._48_4_ = (uint)bVar5 * auVar68._48_4_ | (uint)!bVar5 * auVar70._48_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xd) & 1);
              auVar72._52_4_ = (uint)bVar5 * auVar68._52_4_ | (uint)!bVar5 * auVar70._52_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xe) & 1);
              auVar72._56_4_ = (uint)bVar5 * auVar68._56_4_ | (uint)!bVar5 * auVar70._56_4_;
              bVar5 = SUB81(uVar54 >> 0xf,0);
              auVar72._60_4_ = (uint)bVar5 * auVar68._60_4_ | (uint)!bVar5 * auVar70._60_4_;
              auVar68 = vrcp14ps_avx512f(auVar71);
              auVar70 = vmulps_avx512f(auVar72,auVar68);
              auVar71 = vfmsub213ps_avx512f(auVar71,auVar70,auVar72);
              auVar68 = vfnmadd213ps_avx512f(auVar71,auVar68,auVar70);
              auVar70 = vmulps_avx512f(auVar68,auVar68);
              uVar39 = vcmpps_avx512f(auVar74,auVar99,4);
              auVar71 = vmulps_avx512f(auVar70,auVar70);
              auVar72 = vfmadd213ps_avx512f(auVar58,auVar71,auVar59);
              auVar72 = vfmadd213ps_avx512f(auVar72,auVar71,auVar60);
              auVar73 = vfmadd213ps_avx512f(auVar62,auVar71,auVar63);
              auVar73 = vfmadd213ps_avx512f(auVar73,auVar71,auVar64);
              auVar72 = vfmadd213ps_avx512f(auVar72,auVar71,auVar61);
              auVar73 = vfmadd213ps_avx512f(auVar73,auVar71,auVar65);
              auVar71 = vfmadd213ps_avx512f(auVar73,auVar71,auVar57);
              auVar70 = vfmadd231ps_avx512f(auVar71,auVar70,auVar72);
              uVar40 = vcmpps_avx512f(auVar74,auVar99,1);
              auVar68 = vmulps_avx512f(auVar70,auVar68);
              auVar71 = vaddps_avx512f(auVar68,auVar66);
              bVar5 = (bool)((byte)uVar54 & 1);
              auVar70._0_4_ = (uint)bVar5 * auVar71._0_4_ | (uint)!bVar5 * auVar68._0_4_;
              bVar5 = (bool)((byte)(uVar54 >> 1) & 1);
              auVar70._4_4_ = (uint)bVar5 * auVar71._4_4_ | (uint)!bVar5 * auVar68._4_4_;
              bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
              auVar70._8_4_ = (uint)bVar5 * auVar71._8_4_ | (uint)!bVar5 * auVar68._8_4_;
              bVar5 = (bool)((byte)(uVar54 >> 3) & 1);
              auVar70._12_4_ = (uint)bVar5 * auVar71._12_4_ | (uint)!bVar5 * auVar68._12_4_;
              bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
              auVar70._16_4_ = (uint)bVar5 * auVar71._16_4_ | (uint)!bVar5 * auVar68._16_4_;
              bVar5 = (bool)((byte)(uVar54 >> 5) & 1);
              auVar70._20_4_ = (uint)bVar5 * auVar71._20_4_ | (uint)!bVar5 * auVar68._20_4_;
              bVar5 = (bool)((byte)(uVar54 >> 6) & 1);
              auVar70._24_4_ = (uint)bVar5 * auVar71._24_4_ | (uint)!bVar5 * auVar68._24_4_;
              bVar5 = (bool)((byte)(uVar54 >> 7) & 1);
              auVar70._28_4_ = (uint)bVar5 * auVar71._28_4_ | (uint)!bVar5 * auVar68._28_4_;
              bVar5 = (bool)(bVar21 & 1);
              auVar70._32_4_ = (uint)bVar5 * auVar71._32_4_ | (uint)!bVar5 * auVar68._32_4_;
              bVar5 = (bool)((byte)(uVar54 >> 9) & 1);
              auVar70._36_4_ = (uint)bVar5 * auVar71._36_4_ | (uint)!bVar5 * auVar68._36_4_;
              bVar5 = (bool)((byte)(uVar54 >> 10) & 1);
              auVar70._40_4_ = (uint)bVar5 * auVar71._40_4_ | (uint)!bVar5 * auVar68._40_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xb) & 1);
              auVar70._44_4_ = (uint)bVar5 * auVar71._44_4_ | (uint)!bVar5 * auVar68._44_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xc) & 1);
              auVar70._48_4_ = (uint)bVar5 * auVar71._48_4_ | (uint)!bVar5 * auVar68._48_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xd) & 1);
              auVar70._52_4_ = (uint)bVar5 * auVar71._52_4_ | (uint)!bVar5 * auVar68._52_4_;
              bVar5 = (bool)((byte)(uVar54 >> 0xe) & 1);
              auVar70._56_4_ = (uint)bVar5 * auVar71._56_4_ | (uint)!bVar5 * auVar68._56_4_;
              bVar5 = SUB81(uVar54 >> 0xf,0);
              auVar70._60_4_ = (uint)bVar5 * auVar71._60_4_ | (uint)!bVar5 * auVar68._60_4_;
              auVar74 = vpternlogd_avx512f(auVar74,auVar55,auVar67,0xea);
              auVar68 = vpternlogd_avx512f(auVar70,auVar69,auVar55,0xf8);
              uVar54 = vcmpps_avx512f(auVar74,auVar99,1);
              auVar74 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar70 = vaddps_avx512f(auVar68,local_c0);
              bVar5 = (bool)((byte)uVar40 & 1);
              auVar69._0_4_ = (uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar68._0_4_;
              bVar5 = (bool)((byte)(uVar40 >> 1) & 1);
              auVar69._4_4_ = (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * auVar68._4_4_;
              bVar5 = (bool)((byte)(uVar40 >> 2) & 1);
              auVar69._8_4_ = (uint)bVar5 * auVar70._8_4_ | (uint)!bVar5 * auVar68._8_4_;
              bVar5 = (bool)((byte)(uVar40 >> 3) & 1);
              auVar69._12_4_ = (uint)bVar5 * auVar70._12_4_ | (uint)!bVar5 * auVar68._12_4_;
              bVar5 = (bool)((byte)(uVar40 >> 4) & 1);
              auVar69._16_4_ = (uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * auVar68._16_4_;
              bVar5 = (bool)((byte)(uVar40 >> 5) & 1);
              auVar69._20_4_ = (uint)bVar5 * auVar70._20_4_ | (uint)!bVar5 * auVar68._20_4_;
              bVar5 = (bool)((byte)(uVar40 >> 6) & 1);
              auVar69._24_4_ = (uint)bVar5 * auVar70._24_4_ | (uint)!bVar5 * auVar68._24_4_;
              bVar5 = (bool)((byte)(uVar40 >> 7) & 1);
              auVar69._28_4_ = (uint)bVar5 * auVar70._28_4_ | (uint)!bVar5 * auVar68._28_4_;
              bVar5 = (bool)((byte)(uVar40 >> 8) & 1);
              auVar69._32_4_ = (uint)bVar5 * auVar70._32_4_ | (uint)!bVar5 * auVar68._32_4_;
              bVar5 = (bool)((byte)(uVar40 >> 9) & 1);
              auVar69._36_4_ = (uint)bVar5 * auVar70._36_4_ | (uint)!bVar5 * auVar68._36_4_;
              bVar5 = (bool)((byte)(uVar40 >> 10) & 1);
              auVar69._40_4_ = (uint)bVar5 * auVar70._40_4_ | (uint)!bVar5 * auVar68._40_4_;
              bVar5 = (bool)((byte)(uVar40 >> 0xb) & 1);
              auVar69._44_4_ = (uint)bVar5 * auVar70._44_4_ | (uint)!bVar5 * auVar68._44_4_;
              bVar5 = (bool)((byte)(uVar40 >> 0xc) & 1);
              auVar69._48_4_ = (uint)bVar5 * auVar70._48_4_ | (uint)!bVar5 * auVar68._48_4_;
              bVar5 = (bool)((byte)(uVar40 >> 0xd) & 1);
              auVar69._52_4_ = (uint)bVar5 * auVar70._52_4_ | (uint)!bVar5 * auVar68._52_4_;
              bVar5 = (bool)((byte)(uVar40 >> 0xe) & 1);
              auVar69._56_4_ = (uint)bVar5 * auVar70._56_4_ | (uint)!bVar5 * auVar68._56_4_;
              bVar5 = SUB81(uVar40 >> 0xf,0);
              auVar69._60_4_ = (uint)bVar5 * auVar70._60_4_ | (uint)!bVar5 * auVar68._60_4_;
              auVar68 = vblendmps_avx512f(auVar93,auVar69);
              bVar5 = (bool)((byte)uVar39 & 1);
              bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
              bVar9 = (bool)((byte)(uVar39 >> 2) & 1);
              bVar11 = (bool)((byte)(uVar39 >> 3) & 1);
              bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar39 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar39 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar39 >> 8) & 1);
              bVar24 = (bool)((byte)(uVar39 >> 9) & 1);
              bVar26 = (bool)((byte)(uVar39 >> 10) & 1);
              bVar28 = (bool)((byte)(uVar39 >> 0xb) & 1);
              bVar30 = (bool)((byte)(uVar39 >> 0xc) & 1);
              bVar32 = (bool)((byte)(uVar39 >> 0xd) & 1);
              bVar34 = (bool)((byte)(uVar39 >> 0xe) & 1);
              bVar36 = SUB81(uVar39 >> 0xf,0);
              bVar6 = (bool)((byte)uVar53 & 1);
              bVar8 = (bool)((byte)(uVar53 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar53 >> 2) & 1);
              bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar53 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar53 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar53 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar53 >> 7) & 1);
              bVar23 = (bool)((byte)(uVar53 >> 8) & 1);
              bVar25 = (bool)((byte)(uVar53 >> 9) & 1);
              bVar27 = (bool)((byte)(uVar53 >> 10) & 1);
              bVar29 = (bool)((byte)(uVar53 >> 0xb) & 1);
              bVar31 = (bool)((byte)(uVar53 >> 0xc) & 1);
              bVar33 = (bool)((byte)(uVar53 >> 0xd) & 1);
              bVar35 = (bool)((byte)(uVar53 >> 0xe) & 1);
              bVar37 = SUB81(uVar53 >> 0xf,0);
              *pfVar51 = (float)((uint)bVar6 *
                                 ((uint)bVar5 * auVar68._0_4_ | !bVar5 * auVar69._0_4_) |
                                (uint)!bVar6 * (uint)((byte)uVar54 & 1) * auVar74._0_4_);
              pfVar51[1] = (float)((uint)bVar8 *
                                   ((uint)bVar7 * auVar68._4_4_ | !bVar7 * auVar69._4_4_) |
                                  (uint)!bVar8 * (uint)((byte)(uVar54 >> 1) & 1) * auVar74._4_4_);
              pfVar51[2] = (float)((uint)bVar10 *
                                   ((uint)bVar9 * auVar68._8_4_ | !bVar9 * auVar69._8_4_) |
                                  (uint)!bVar10 * (uint)((byte)(uVar54 >> 2) & 1) * auVar74._8_4_);
              pfVar51[3] = (float)((uint)bVar12 *
                                   ((uint)bVar11 * auVar68._12_4_ | !bVar11 * auVar69._12_4_) |
                                  (uint)!bVar12 * (uint)((byte)(uVar54 >> 3) & 1) * auVar74._12_4_);
              pfVar51[4] = (float)((uint)bVar14 *
                                   ((uint)bVar13 * auVar68._16_4_ | !bVar13 * auVar69._16_4_) |
                                  (uint)!bVar14 * (uint)((byte)(uVar54 >> 4) & 1) * auVar74._16_4_);
              pfVar51[5] = (float)((uint)bVar16 *
                                   ((uint)bVar15 * auVar68._20_4_ | !bVar15 * auVar69._20_4_) |
                                  (uint)!bVar16 * (uint)((byte)(uVar54 >> 5) & 1) * auVar74._20_4_);
              pfVar51[6] = (float)((uint)bVar18 *
                                   ((uint)bVar17 * auVar68._24_4_ | !bVar17 * auVar69._24_4_) |
                                  (uint)!bVar18 * (uint)((byte)(uVar54 >> 6) & 1) * auVar74._24_4_);
              pfVar51[7] = (float)((uint)bVar20 *
                                   ((uint)bVar19 * auVar68._28_4_ | !bVar19 * auVar69._28_4_) |
                                  (uint)!bVar20 * (uint)((byte)(uVar54 >> 7) & 1) * auVar74._28_4_);
              pfVar51[8] = (float)((uint)bVar23 *
                                   ((uint)bVar22 * auVar68._32_4_ | !bVar22 * auVar69._32_4_) |
                                  (uint)!bVar23 * (uint)((byte)(uVar54 >> 8) & 1) * auVar74._32_4_);
              pfVar51[9] = (float)((uint)bVar25 *
                                   ((uint)bVar24 * auVar68._36_4_ | !bVar24 * auVar69._36_4_) |
                                  (uint)!bVar25 * (uint)((byte)(uVar54 >> 9) & 1) * auVar74._36_4_);
              pfVar51[10] = (float)((uint)bVar27 *
                                    ((uint)bVar26 * auVar68._40_4_ | !bVar26 * auVar69._40_4_) |
                                   (uint)!bVar27 * (uint)((byte)(uVar54 >> 10) & 1) * auVar74._40_4_
                                   );
              pfVar51[0xb] = (float)((uint)bVar29 *
                                     ((uint)bVar28 * auVar68._44_4_ | !bVar28 * auVar69._44_4_) |
                                    (uint)!bVar29 *
                                    (uint)((byte)(uVar54 >> 0xb) & 1) * auVar74._44_4_);
              pfVar51[0xc] = (float)((uint)bVar31 *
                                     ((uint)bVar30 * auVar68._48_4_ | !bVar30 * auVar69._48_4_) |
                                    (uint)!bVar31 *
                                    (uint)((byte)(uVar54 >> 0xc) & 1) * auVar74._48_4_);
              pfVar51[0xd] = (float)((uint)bVar33 *
                                     ((uint)bVar32 * auVar68._52_4_ | !bVar32 * auVar69._52_4_) |
                                    (uint)!bVar33 *
                                    (uint)((byte)(uVar54 >> 0xd) & 1) * auVar74._52_4_);
              pfVar51[0xe] = (float)((uint)bVar35 *
                                     ((uint)bVar34 * auVar68._56_4_ | !bVar34 * auVar69._56_4_) |
                                    (uint)!bVar35 *
                                    (uint)((byte)(uVar54 >> 0xe) & 1) * auVar74._56_4_);
              pfVar51[0xf] = (float)((uint)bVar37 *
                                     ((uint)bVar36 * auVar68._60_4_ | !bVar36 * auVar69._60_4_) |
                                    (uint)!bVar37 * (uint)(byte)(uVar54 >> 0xf) * auVar74._60_4_);
              pauVar44 = pauVar44 + 1;
              pfVar51 = pfVar51 + 0x10;
              iVar45 = iVar45 + 0x10;
              uVar42 = local_264;
            } while (iVar45 < (int)uVar46);
          }
          local_140 = local_180._0_32_;
          if ((int)(uVar42 | 7) < (int)uVar46) {
            uVar43 = uVar42;
            do {
              uVar83 = *(undefined8 *)*pauVar44;
              uVar82 = *(undefined8 *)(*pauVar44 + 8);
              uVar84 = *(undefined8 *)(*pauVar44 + 0x10);
              uVar85 = *(undefined8 *)(*pauVar44 + 0x18);
              afStack_1f0 = (float  [2])uVar84;
              afStack_1e8 = (float  [2])uVar85;
              local_200._0_8_ = uVar83;
              local_200._8_8_ = uVar82;
              BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                        (local_260,(__m256 *)local_200,&local_140);
              *(undefined8 *)pfVar51 = uVar83;
              *(undefined8 *)(pfVar51 + 2) = uVar82;
              *(undefined8 *)(pfVar51 + 4) = uVar84;
              *(undefined8 *)(pfVar51 + 6) = uVar85;
              pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
              pfVar51 = pfVar51 + 8;
              uVar42 = uVar43 + 8;
              iVar45 = uVar43 + 0xf;
              uVar43 = uVar42;
              afStack_1f0 = (float  [2])uVar84;
              afStack_1e8 = (float  [2])uVar85;
            } while (iVar45 < (int)uVar46);
          }
          auVar93 = vmovdqa64_avx512f(_local_180);
          local_200 = auVar93._0_16_;
          uVar43 = uVar42 | 3;
          while ((int)uVar43 < (int)uVar46) {
            local_240 = *(float (*) [2])*pauVar44;
            uVar83 = *(undefined8 *)(*pauVar44 + 8);
            afStack_238 = (float  [2])uVar83;
            afVar100 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                 (local_260,(__m128 *)local_240,&local_200);
            local_240 = afVar100._0_8_;
            *(float (*) [2])pfVar51 = local_240;
            *(undefined8 *)(pfVar51 + 2) = uVar83;
            pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
            pfVar51 = pfVar51 + 4;
            uVar43 = uVar42 + 7;
            uVar42 = uVar42 + 4;
            afStack_238 = (float  [2])uVar83;
          }
          if ((int)uVar42 < (int)uVar46) {
            lVar49 = 0;
            do {
              fVar78 = atan2f((float)local_190._0_4_,*(float *)(*pauVar44 + lVar49 * 4));
              pfVar51[lVar49] = fVar78;
              lVar49 = lVar49 + 1;
            } while (uVar46 - uVar42 != (int)lVar49);
          }
          local_270 = local_270 + 1;
          auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar53 = (ulong)local_27a;
          auVar55 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar56 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar57 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar58 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar59 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar60 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar61 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar62 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar63 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar64 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar65 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar66 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar67 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar93 = local_100;
        } while (local_270 != local_278);
      }
    }
  }
  else {
    uVar42 = m->dims;
    uVar43 = pMVar41->dims;
    opt_00 = (Option *)(ulong)uVar43;
    if ((((uVar42 == uVar43) && (m->w == iVar50)) &&
        ((m->h == iVar1 && ((m->d == iVar2 && (m->c == iVar3)))))) && (m->elempack == iVar45)) {
      binary_op_no_broadcast(m,pMVar41,pMVar4,uVar46,opt_00);
    }
    else if (((((int)uVar43 < (int)uVar42) || (((iVar50 == 1 && (uVar42 == 2)) && (iVar1 == m->h))))
             || ((((iVar50 == 1 && (iVar1 == 1)) && ((uVar42 == 3 && (iVar3 == m->c)))) ||
                 ((((iVar50 == 1 && (uVar42 == 3)) && ((iVar1 == m->h && (iVar3 == m->c)))) ||
                  ((((iVar50 == 1 && (iVar1 == 1)) && (iVar2 == 1)) &&
                   ((uVar42 == 4 && (iVar3 == m->c)))))))))) ||
            ((((iVar50 == 1 && ((iVar1 == 1 && (uVar42 == 4)))) &&
              ((iVar2 == m->d && (iVar3 == m->c)))) ||
             ((((iVar50 == 1 && (uVar42 == 4)) && (iVar1 == m->h)) &&
              ((iVar2 == m->d && (iVar3 == m->c)))))))) {
      binary_op_broadcast_inner(m,pMVar41,pMVar4,uVar46,opt_00);
    }
    else {
      if ((iVar45 != 1) ||
         (((((uVar42 != 2 || (iVar1 != 1)) || (iVar50 != m->w)) &&
           ((uVar42 != 3 ||
            ((((iVar3 != 1 || (iVar1 != 1)) || (iVar50 != m->w)) &&
             (((iVar50 != m->w || (iVar3 != 1)) || (iVar1 != m->h)))))))) &&
          ((uVar42 != 4 ||
           ((((iVar3 != 1 || (iVar2 != 1)) || ((iVar1 != 1 || (iVar50 != m->w)))) &&
            (((((iVar50 != m->w || (iVar3 != 1)) || (iVar2 != 1)) || (iVar1 != m->h)) &&
             ((((iVar50 != m->w || (iVar1 != m->h)) || (iVar3 != 1)) || (iVar2 != m->d)))))))))))) {
        uVar42 = uVar43 ^ 3 | uVar42 ^ 3;
        if (uVar42 != 0) {
          return 0;
        }
        if (iVar1 != 1) {
          return 0;
        }
        if (m->w != iVar50) {
          return 0;
        }
        if (m->c == iVar3) {
          binary_op_broadcast_20(m,pMVar41,pMVar4,uVar46,(Option *)(ulong)uVar42);
          return 0;
        }
        return 0;
      }
      binary_op_broadcast_outer(m,pMVar41,pMVar4,uVar46,opt_00);
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}